

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::GenRootTableFuncs(RustGenerator *this,StructDef *struct_def)

{
  long lVar1;
  allocator<char> local_fb1;
  string local_fb0;
  allocator<char> local_f89;
  string local_f88;
  allocator<char> local_f61;
  string local_f60;
  allocator<char> local_f39;
  string local_f38;
  allocator<char> local_f11;
  string local_f10;
  allocator<char> local_ee9;
  string local_ee8;
  allocator<char> local_ec1;
  string local_ec0;
  allocator<char> local_e99;
  string local_e98;
  allocator<char> local_e71;
  string local_e70;
  allocator<char> local_e49;
  string local_e48;
  allocator<char> local_e21;
  string local_e20;
  allocator<char> local_df9;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  allocator<char> local_da9;
  string local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  allocator<char> local_d41;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  allocator<char> local_cf1;
  string local_cf0;
  allocator<char> local_cc9;
  string local_cc8;
  allocator<char> local_ca1;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  allocator<char> local_c29;
  string local_c28;
  allocator<char> local_c01;
  string local_c00;
  allocator<char> local_bd9;
  string local_bd8;
  allocator<char> local_bb1;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  allocator<char> local_b61;
  string local_b60;
  allocator<char> local_b39;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  RustGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == (StructDef *)0x0) {
    __assert_fail("parser_.root_struct_def_ && \"root table not defined\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x982,
                  "void flatbuffers::rust::RustGenerator::GenRootTableFuncs(const StructDef &)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"STRUCT_TY",&local_39);
  IdlNamer::Type_abi_cxx11_(&local_70,&this->namer_,local_18);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"STRUCT_FN",&local_91);
  IdlNamer::Function_abi_cxx11_(&local_b8,&this->namer_,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"STRUCT_CONST",&local_d9);
  Namer::Constant(&local_100,&(this->namer_).super_Namer,(string *)local_18);
  CodeWriter::SetValue(&this->code_,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"#[inline]",&local_121);
  CodeWriter::operator+=(&this->code_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"/// Verifies that a buffer of bytes contains a `{{STRUCT_TY}}`",
             &local_149);
  CodeWriter::operator+=(&this->code_,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"/// and returns it.",&local_171);
  CodeWriter::operator+=(&this->code_,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"/// Note that verification is still experimental and may not",
             &local_199);
  CodeWriter::operator+=(&this->code_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"/// catch every error, or be maximally performant. For the",
             &local_1c1);
  CodeWriter::operator+=(&this->code_,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"/// previous, unchecked, behavior use",&local_1e9);
  CodeWriter::operator+=(&this->code_,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"/// `root_as_{{STRUCT_FN}}_unchecked`.",&local_211);
  CodeWriter::operator+=(&this->code_,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "pub fn root_as_{{STRUCT_FN}}(buf: &[u8]) -> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {"
             ,&local_239);
  CodeWriter::operator+=(&this->code_,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"  flatbuffers::root::<{{STRUCT_TY}}>(buf)",&local_261);
  CodeWriter::operator+=(&this->code_,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"}",&local_289);
  CodeWriter::operator+=(&this->code_,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"#[inline]",&local_2b1);
  CodeWriter::operator+=(&this->code_,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"/// Verifies that a buffer of bytes contains a size prefixed",
             &local_2d9);
  CodeWriter::operator+=(&this->code_,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"/// `{{STRUCT_TY}}` and returns it.",&local_301);
  CodeWriter::operator+=(&this->code_,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"/// Note that verification is still experimental and may not",
             &local_329);
  CodeWriter::operator+=(&this->code_,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"/// catch every error, or be maximally performant. For the",
             &local_351);
  CodeWriter::operator+=(&this->code_,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"/// previous, unchecked, behavior use",&local_379);
  CodeWriter::operator+=(&this->code_,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"/// `size_prefixed_root_as_{{STRUCT_FN}}_unchecked`.",&local_3a1)
  ;
  CodeWriter::operator+=(&this->code_,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,
             "pub fn size_prefixed_root_as_{{STRUCT_FN}}(buf: &[u8]) -> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {"
             ,&local_3c9);
  CodeWriter::operator+=(&this->code_,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"  flatbuffers::size_prefixed_root::<{{STRUCT_TY}}>(buf)",
             &local_3f1);
  CodeWriter::operator+=(&this->code_,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"}",&local_419);
  CodeWriter::operator+=(&this->code_,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"#[inline]",&local_441);
  CodeWriter::operator+=(&this->code_,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"/// Verifies, with the given options, that a buffer of bytes",
             &local_469);
  CodeWriter::operator+=(&this->code_,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"/// contains a `{{STRUCT_TY}}` and returns it.",&local_491);
  CodeWriter::operator+=(&this->code_,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"/// Note that verification is still experimental and may not",
             &local_4b9);
  CodeWriter::operator+=(&this->code_,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"/// catch every error, or be maximally performant. For the",
             &local_4e1);
  CodeWriter::operator+=(&this->code_,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"/// previous, unchecked, behavior use",&local_509);
  CodeWriter::operator+=(&this->code_,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"/// `root_as_{{STRUCT_FN}}_unchecked`.",&local_531);
  CodeWriter::operator+=(&this->code_,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"pub fn root_as_{{STRUCT_FN}}_with_opts<\'b, \'o>(",&local_559);
  CodeWriter::operator+=(&this->code_,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"  opts: &\'o flatbuffers::VerifierOptions,",&local_581);
  CodeWriter::operator+=(&this->code_,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"  buf: &\'b [u8],",&local_5a9);
  CodeWriter::operator+=(&this->code_,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,
             ") -> Result<{{STRUCT_TY}}<\'b>, flatbuffers::InvalidFlatbuffer> {",&local_5d1);
  CodeWriter::operator+=(&this->code_,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"  flatbuffers::root_with_opts::<{{STRUCT_TY}}<\'b>>(opts, buf)",
             &local_5f9);
  CodeWriter::operator+=(&this->code_,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"}",&local_621);
  CodeWriter::operator+=(&this->code_,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"#[inline]",&local_649);
  CodeWriter::operator+=(&this->code_,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"/// Verifies, with the given verifier options, that a buffer of",
             &local_671);
  CodeWriter::operator+=(&this->code_,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"/// bytes contains a size prefixed `{{STRUCT_TY}}` and returns",
             &local_699);
  CodeWriter::operator+=(&this->code_,&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"/// it. Note that verification is still experimental and may not"
             ,&local_6c1);
  CodeWriter::operator+=(&this->code_,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"/// catch every error, or be maximally performant. For the",
             &local_6e9);
  CodeWriter::operator+=(&this->code_,&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"/// previous, unchecked, behavior use",&local_711);
  CodeWriter::operator+=(&this->code_,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"/// `root_as_{{STRUCT_FN}}_unchecked`.",&local_739);
  CodeWriter::operator+=(&this->code_,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"pub fn size_prefixed_root_as_{{STRUCT_FN}}_with_opts<\'b, \'o>(",
             &local_761);
  CodeWriter::operator+=(&this->code_,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"  opts: &\'o flatbuffers::VerifierOptions,",&local_789);
  CodeWriter::operator+=(&this->code_,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"  buf: &\'b [u8],",&local_7b1);
  CodeWriter::operator+=(&this->code_,&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,
             ") -> Result<{{STRUCT_TY}}<\'b>, flatbuffers::InvalidFlatbuffer> {",&local_7d9);
  CodeWriter::operator+=(&this->code_,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,
             "  flatbuffers::size_prefixed_root_with_opts::<{{STRUCT_TY}}<\'b>>(opts, buf)",
             &local_801);
  CodeWriter::operator+=(&this->code_,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"}",&local_829);
  CodeWriter::operator+=(&this->code_,&local_828);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"#[inline]",&local_851);
  CodeWriter::operator+=(&this->code_,&local_850);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,
             "/// Assumes, without verification, that a buffer of bytes contains a {{STRUCT_TY}} and returns it."
             ,&local_879);
  CodeWriter::operator+=(&this->code_,&local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator(&local_879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"/// # Safety",&local_8a1)
  ;
  CodeWriter::operator+=(&this->code_,&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,
             "/// Callers must trust the given bytes do indeed contain a valid `{{STRUCT_TY}}`.",
             &local_8c9);
  CodeWriter::operator+=(&this->code_,&local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,
             "pub unsafe fn root_as_{{STRUCT_FN}}_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {",
             &local_8f1);
  CodeWriter::operator+=(&this->code_,&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"  flatbuffers::root_unchecked::<{{STRUCT_TY}}>(buf)",&local_919);
  CodeWriter::operator+=(&this->code_,&local_918);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"}",&local_941);
  CodeWriter::operator+=(&this->code_,&local_940);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"#[inline]",&local_969);
  CodeWriter::operator+=(&this->code_,&local_968);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,
             "/// Assumes, without verification, that a buffer of bytes contains a size prefixed {{STRUCT_TY}} and returns it."
             ,&local_991);
  CodeWriter::operator+=(&this->code_,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"/// # Safety",&local_9b9)
  ;
  CodeWriter::operator+=(&this->code_,&local_9b8);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,
             "/// Callers must trust the given bytes do indeed contain a valid size prefixed `{{STRUCT_TY}}`."
             ,&local_9e1);
  CodeWriter::operator+=(&this->code_,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,
             "pub unsafe fn size_prefixed_root_as_{{STRUCT_FN}}_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {"
             ,&local_a09);
  CodeWriter::operator+=(&this->code_,&local_a08);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a30,
             "  flatbuffers::size_prefixed_root_unchecked::<{{STRUCT_TY}}>(buf)",&local_a31);
  CodeWriter::operator+=(&this->code_,&local_a30);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"}",&local_a59);
  CodeWriter::operator+=(&this->code_,&local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator(&local_a59);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"pub const {{STRUCT_CONST}}_IDENTIFIER: &str\\",&local_a81);
    CodeWriter::operator+=(&this->code_,&local_a80);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator(&local_a81);
    std::operator+(&local_ac8," = \"",&((this->super_BaseGenerator).parser_)->file_identifier_);
    std::operator+(&local_aa8,&local_ac8,"\";");
    CodeWriter::operator+=(&this->code_,&local_aa8);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"",&local_ae9);
    CodeWriter::operator+=(&this->code_,&local_ae8);
    std::__cxx11::string::~string((string *)&local_ae8);
    std::allocator<char>::~allocator(&local_ae9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b10,"#[inline]",&local_b11);
    CodeWriter::operator+=(&this->code_,&local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    std::allocator<char>::~allocator(&local_b11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b38,"pub fn {{STRUCT_FN}}_buffer_has_identifier\\",&local_b39);
    CodeWriter::operator+=(&this->code_,&local_b38);
    std::__cxx11::string::~string((string *)&local_b38);
    std::allocator<char>::~allocator(&local_b39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b60,"(buf: &[u8]) -> bool {",&local_b61);
    CodeWriter::operator+=(&this->code_,&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
    std::allocator<char>::~allocator(&local_b61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b88,"  flatbuffers::buffer_has_identifier(buf, \\",&local_b89);
    CodeWriter::operator+=(&this->code_,&local_b88);
    std::__cxx11::string::~string((string *)&local_b88);
    std::allocator<char>::~allocator(&local_b89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb0,"{{STRUCT_CONST}}_IDENTIFIER, false)",&local_bb1);
    CodeWriter::operator+=(&this->code_,&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::allocator<char>::~allocator(&local_bb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd8,"}",&local_bd9);
    CodeWriter::operator+=(&this->code_,&local_bd8);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::allocator<char>::~allocator(&local_bd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c00,"",&local_c01);
    CodeWriter::operator+=(&this->code_,&local_c00);
    std::__cxx11::string::~string((string *)&local_c00);
    std::allocator<char>::~allocator(&local_c01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c28,"#[inline]",&local_c29);
    CodeWriter::operator+=(&this->code_,&local_c28);
    std::__cxx11::string::~string((string *)&local_c28);
    std::allocator<char>::~allocator(&local_c29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c50,"pub fn {{STRUCT_FN}}_size_prefixed\\",&local_c51);
    CodeWriter::operator+=(&this->code_,&local_c50);
    std::__cxx11::string::~string((string *)&local_c50);
    std::allocator<char>::~allocator(&local_c51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c78,"_buffer_has_identifier(buf: &[u8]) -> bool {",&local_c79);
    CodeWriter::operator+=(&this->code_,&local_c78);
    std::__cxx11::string::~string((string *)&local_c78);
    std::allocator<char>::~allocator(&local_c79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca0,"  flatbuffers::buffer_has_identifier(buf, \\",&local_ca1);
    CodeWriter::operator+=(&this->code_,&local_ca0);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::allocator<char>::~allocator(&local_ca1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc8,"{{STRUCT_CONST}}_IDENTIFIER, true)",&local_cc9);
    CodeWriter::operator+=(&this->code_,&local_cc8);
    std::__cxx11::string::~string((string *)&local_cc8);
    std::allocator<char>::~allocator(&local_cc9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf0,"}",&local_cf1);
    CodeWriter::operator+=(&this->code_,&local_cf0);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::allocator<char>::~allocator(&local_cf1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"",&local_d19);
    CodeWriter::operator+=(&this->code_,&local_d18);
    std::__cxx11::string::~string((string *)&local_d18);
    std::allocator<char>::~allocator(&local_d19);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d40,"pub const {{STRUCT_CONST}}_EXTENSION: &str = \\",&local_d41);
    CodeWriter::operator+=(&this->code_,&local_d40);
    std::__cxx11::string::~string((string *)&local_d40);
    std::allocator<char>::~allocator(&local_d41);
    std::operator+(&local_d88,"\"",&((this->super_BaseGenerator).parser_)->file_extension_);
    std::operator+(&local_d68,&local_d88,"\";");
    CodeWriter::operator+=(&this->code_,&local_d68);
    std::__cxx11::string::~string((string *)&local_d68);
    std::__cxx11::string::~string((string *)&local_d88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_da8,"",&local_da9);
    CodeWriter::operator+=(&this->code_,&local_da8);
    std::__cxx11::string::~string((string *)&local_da8);
    std::allocator<char>::~allocator(&local_da9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd0,"#[inline]",&local_dd1);
  CodeWriter::operator+=(&this->code_,&local_dd0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_df8,
             "pub fn finish_{{STRUCT_FN}}_buffer<\'a, \'b, A: flatbuffers::Allocator + \'a>(",
             &local_df9);
  CodeWriter::operator+=(&this->code_,&local_df8);
  std::__cxx11::string::~string((string *)&local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e20,"    fbb: &\'b mut flatbuffers::FlatBufferBuilder<\'a, A>,",
             &local_e21);
  CodeWriter::operator+=(&this->code_,&local_e20);
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator(&local_e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e48,"    root: flatbuffers::WIPOffset<{{STRUCT_TY}}<\'a>>) {",
             &local_e49);
  CodeWriter::operator+=(&this->code_,&local_e48);
  std::__cxx11::string::~string((string *)&local_e48);
  std::allocator<char>::~allocator(&local_e49);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e98,"  fbb.finish(root, None);",&local_e99);
    CodeWriter::operator+=(&this->code_,&local_e98);
    std::__cxx11::string::~string((string *)&local_e98);
    std::allocator<char>::~allocator(&local_e99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e70,"  fbb.finish(root, Some({{STRUCT_CONST}}_IDENTIFIER));",
               &local_e71);
    CodeWriter::operator+=(&this->code_,&local_e70);
    std::__cxx11::string::~string((string *)&local_e70);
    std::allocator<char>::~allocator(&local_e71);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ec0,"}",&local_ec1);
  CodeWriter::operator+=(&this->code_,&local_ec0);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::allocator<char>::~allocator(&local_ec1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee8,"",&local_ee9);
  CodeWriter::operator+=(&this->code_,&local_ee8);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::allocator<char>::~allocator(&local_ee9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f10,"#[inline]",&local_f11);
  CodeWriter::operator+=(&this->code_,&local_f10);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator(&local_f11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f38,
             "pub fn finish_size_prefixed_{{STRUCT_FN}}_buffer<\'a, \'b, A: flatbuffers::Allocator + \'a>(fbb: &\'b mut flatbuffers::FlatBufferBuilder<\'a, A>, root: flatbuffers::WIPOffset<{{STRUCT_TY}}<\'a>>) {"
             ,&local_f39);
  CodeWriter::operator+=(&this->code_,&local_f38);
  std::__cxx11::string::~string((string *)&local_f38);
  std::allocator<char>::~allocator(&local_f39);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f88,"  fbb.finish_size_prefixed(root, None);",&local_f89);
    CodeWriter::operator+=(&this->code_,&local_f88);
    std::__cxx11::string::~string((string *)&local_f88);
    std::allocator<char>::~allocator(&local_f89);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f60,
               "  fbb.finish_size_prefixed(root, Some({{STRUCT_CONST}}_IDENTIFIER));",&local_f61);
    CodeWriter::operator+=(&this->code_,&local_f60);
    std::__cxx11::string::~string((string *)&local_f60);
    std::allocator<char>::~allocator(&local_f61);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fb0,"}",&local_fb1);
  CodeWriter::operator+=(&this->code_,&local_fb0);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::allocator<char>::~allocator(&local_fb1);
  return;
}

Assistant:

void GenRootTableFuncs(const StructDef &struct_def) {
    FLATBUFFERS_ASSERT(parser_.root_struct_def_ && "root table not defined");
    code_.SetValue("STRUCT_TY", namer_.Type(struct_def));
    code_.SetValue("STRUCT_FN", namer_.Function(struct_def));
    code_.SetValue("STRUCT_CONST", namer_.Constant(struct_def.name));

    // Default verifier root fns.
    code_ += "#[inline]";
    code_ += "/// Verifies that a buffer of bytes contains a `{{STRUCT_TY}}`";
    code_ += "/// and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn root_as_{{STRUCT_FN}}(buf: &[u8]) "
        "-> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {";
    code_ += "  flatbuffers::root::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ += "/// Verifies that a buffer of bytes contains a size prefixed";
    code_ += "/// `{{STRUCT_TY}}` and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `size_prefixed_root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn size_prefixed_root_as_{{STRUCT_FN}}"
        "(buf: &[u8]) -> Result<{{STRUCT_TY}}, "
        "flatbuffers::InvalidFlatbuffer> {";
    code_ += "  flatbuffers::size_prefixed_root::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    // Verifier with options root fns.
    code_ += "#[inline]";
    code_ += "/// Verifies, with the given options, that a buffer of bytes";
    code_ += "/// contains a `{{STRUCT_TY}}` and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ += "pub fn root_as_{{STRUCT_FN}}_with_opts<'b, 'o>(";
    code_ += "  opts: &'o flatbuffers::VerifierOptions,";
    code_ += "  buf: &'b [u8],";
    code_ +=
        ") -> Result<{{STRUCT_TY}}<'b>, flatbuffers::InvalidFlatbuffer>"
        " {";
    code_ += "  flatbuffers::root_with_opts::<{{STRUCT_TY}}<'b>>(opts, buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ += "/// Verifies, with the given verifier options, that a buffer of";
    code_ += "/// bytes contains a size prefixed `{{STRUCT_TY}}` and returns";
    code_ += "/// it. Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn size_prefixed_root_as_{{STRUCT_FN}}_with_opts"
        "<'b, 'o>(";
    code_ += "  opts: &'o flatbuffers::VerifierOptions,";
    code_ += "  buf: &'b [u8],";
    code_ +=
        ") -> Result<{{STRUCT_TY}}<'b>, flatbuffers::InvalidFlatbuffer>"
        " {";
    code_ +=
        "  flatbuffers::size_prefixed_root_with_opts::<{{STRUCT_TY}}"
        "<'b>>(opts, buf)";
    code_ += "}";
    // Unchecked root fns.
    code_ += "#[inline]";
    code_ +=
        "/// Assumes, without verification, that a buffer of bytes "
        "contains a {{STRUCT_TY}} and returns it.";
    code_ += "/// # Safety";
    code_ +=
        "/// Callers must trust the given bytes do indeed contain a valid"
        " `{{STRUCT_TY}}`.";
    code_ +=
        "pub unsafe fn root_as_{{STRUCT_FN}}_unchecked"
        "(buf: &[u8]) -> {{STRUCT_TY}} {";
    code_ += "  flatbuffers::root_unchecked::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ +=
        "/// Assumes, without verification, that a buffer of bytes "
        "contains a size prefixed {{STRUCT_TY}} and returns it.";
    code_ += "/// # Safety";
    code_ +=
        "/// Callers must trust the given bytes do indeed contain a valid"
        " size prefixed `{{STRUCT_TY}}`.";
    code_ +=
        "pub unsafe fn size_prefixed_root_as_{{STRUCT_FN}}"
        "_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {";
    code_ +=
        "  flatbuffers::size_prefixed_root_unchecked::<{{STRUCT_TY}}>"
        "(buf)";
    code_ += "}";

    if (parser_.file_identifier_.length()) {
      // Declare the identifier
      // (no lifetime needed as constants have static lifetimes by default)
      code_ += "pub const {{STRUCT_CONST}}_IDENTIFIER: &str\\";
      code_ += " = \"" + parser_.file_identifier_ + "\";";
      code_ += "";

      // Check if a buffer has the identifier.
      code_ += "#[inline]";
      code_ += "pub fn {{STRUCT_FN}}_buffer_has_identifier\\";
      code_ += "(buf: &[u8]) -> bool {";
      code_ += "  flatbuffers::buffer_has_identifier(buf, \\";
      code_ += "{{STRUCT_CONST}}_IDENTIFIER, false)";
      code_ += "}";
      code_ += "";
      code_ += "#[inline]";
      code_ += "pub fn {{STRUCT_FN}}_size_prefixed\\";
      code_ += "_buffer_has_identifier(buf: &[u8]) -> bool {";
      code_ += "  flatbuffers::buffer_has_identifier(buf, \\";
      code_ += "{{STRUCT_CONST}}_IDENTIFIER, true)";
      code_ += "}";
      code_ += "";
    }

    if (parser_.file_extension_.length()) {
      // Return the extension
      code_ += "pub const {{STRUCT_CONST}}_EXTENSION: &str = \\";
      code_ += "\"" + parser_.file_extension_ + "\";";
      code_ += "";
    }

    // Finish a buffer with a given root object:
    code_ += "#[inline]";
    code_ +=
        "pub fn finish_{{STRUCT_FN}}_buffer<'a, 'b, A: "
        "flatbuffers::Allocator + 'a>(";
    code_ += "    fbb: &'b mut flatbuffers::FlatBufferBuilder<'a, A>,";
    code_ += "    root: flatbuffers::WIPOffset<{{STRUCT_TY}}<'a>>) {";
    if (parser_.file_identifier_.length()) {
      code_ += "  fbb.finish(root, Some({{STRUCT_CONST}}_IDENTIFIER));";
    } else {
      code_ += "  fbb.finish(root, None);";
    }
    code_ += "}";
    code_ += "";
    code_ += "#[inline]";
    code_ +=
        "pub fn finish_size_prefixed_{{STRUCT_FN}}_buffer"
        "<'a, 'b, A: flatbuffers::Allocator + 'a>("
        "fbb: &'b mut flatbuffers::FlatBufferBuilder<'a, A>, "
        "root: flatbuffers::WIPOffset<{{STRUCT_TY}}<'a>>) {";
    if (parser_.file_identifier_.length()) {
      code_ +=
          "  fbb.finish_size_prefixed(root, "
          "Some({{STRUCT_CONST}}_IDENTIFIER));";
    } else {
      code_ += "  fbb.finish_size_prefixed(root, None);";
    }
    code_ += "}";
  }